

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O2

int onigenc_utf16_32_get_ctype_code_range
              (OnigCtype ctype,OnigCodePoint *sb_out,OnigCodePoint **ranges)

{
  int iVar1;
  
  *sb_out = 0;
  iVar1 = onigenc_unicode_ctype_code_range(ctype,ranges);
  return iVar1;
}

Assistant:

extern int
onigenc_utf16_32_get_ctype_code_range(OnigCtype ctype, OnigCodePoint* sb_out,
                                      const OnigCodePoint* ranges[])
{
  *sb_out = 0x00;
  return onigenc_unicode_ctype_code_range(ctype, ranges);
}